

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased
               (int field_number,string *value,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  uint8_t *puVar3;
  string *psVar4;
  uint uVar5;
  byte *pbVar6;
  ulong uVar7;
  uint uVar8;
  EpsCopyOutputStream *this;
  int iVar9;
  undefined1 local_30 [16];
  
  pbVar6 = output->cur_;
  if ((output->impl_).end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
  }
  uVar8 = field_number * 8 + 2;
  output->cur_ = pbVar6;
  uVar2 = uVar8;
  if (0x7f < (uint)(field_number << 3)) {
    do {
      *pbVar6 = (byte)uVar2 | 0x80;
      uVar8 = uVar2 >> 7;
      pbVar6 = pbVar6 + 1;
      bVar1 = 0x3fff < uVar2;
      uVar2 = uVar8;
    } while (bVar1);
  }
  *pbVar6 = (byte)uVar8;
  output->cur_ = pbVar6 + 1;
  if ((value->_M_string_length & 0xffffffff80000000) == 0) {
    psVar4 = (string *)0x0;
  }
  else {
    psVar4 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (value->_M_string_length,0x7fffffff,"value.size() <= kInt32MaxSize");
  }
  if (psVar4 != (string *)0x0) {
    iVar9 = (int)local_30;
    WriteBytesMaybeAliased();
    uVar2 = iVar9 << 3;
    pbVar6 = this[1].end_;
    if (this->end_ <= pbVar6) {
      pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(this,pbVar6);
    }
    uVar7 = (ulong)(iVar9 * 8 + 3);
    this[1].end_ = pbVar6;
    if (0x7f < uVar2) {
      do {
        uVar8 = (uint)uVar7;
        *pbVar6 = (byte)uVar7 | 0x80;
        uVar7 = uVar7 >> 7;
        pbVar6 = pbVar6 + 1;
      } while (0x3fff < uVar8);
    }
    *pbVar6 = (byte)uVar7;
    this[1].end_ = pbVar6 + 1;
    pbVar6 = (byte *)(**(code **)(*(long *)psVar4 + 0x28))(psVar4,pbVar6 + 1,this);
    this[1].end_ = pbVar6;
    if (this->end_ <= pbVar6) {
      pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(this,pbVar6);
    }
    uVar5 = uVar2 | 4;
    this[1].end_ = pbVar6;
    uVar8 = uVar5;
    if (0x7f < uVar2) {
      do {
        *pbVar6 = (byte)uVar8 | 0x80;
        uVar5 = uVar8 >> 7;
        pbVar6 = pbVar6 + 1;
        bVar1 = 0x3fff < uVar8;
        uVar8 = uVar5;
      } while (bVar1);
    }
    *pbVar6 = (byte)uVar5;
    this[1].end_ = pbVar6 + 1;
    return;
  }
  uVar2 = (uint)value->_M_string_length;
  pbVar6 = output->cur_;
  if ((output->impl_).end_ <= pbVar6) {
    pbVar6 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar6);
  }
  output->cur_ = pbVar6;
  uVar8 = uVar2;
  if (0x7f < uVar2) {
    do {
      *pbVar6 = (byte)uVar8 | 0x80;
      uVar2 = uVar8 >> 7;
      pbVar6 = pbVar6 + 1;
      bVar1 = 0x3fff < uVar8;
      uVar8 = uVar2;
    } while (bVar1);
  }
  *pbVar6 = (byte)uVar2;
  output->cur_ = pbVar6 + 1;
  puVar3 = io::EpsCopyOutputStream::WriteRawMaybeAliased
                     (&output->impl_,(value->_M_dataplus)._M_p,(int)value->_M_string_length,
                      pbVar6 + 1);
  output->cur_ = puVar3;
  return;
}

Assistant:

void WireFormatLite::WriteBytesMaybeAliased(int field_number,
                                            const std::string& value,
                                            io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_LENGTH_DELIMITED, output);
  ABSL_CHECK_LE(value.size(), kInt32MaxSize);
  output->WriteVarint32(value.size());
  output->WriteRawMaybeAliased(value.data(), value.size());
}